

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::should_check_files(torrent *this)

{
  bool bVar1;
  byte local_19;
  torrent *this_local;
  
  local_19 = 0;
  if ((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7) ==
       1) && (local_19 = 0,
             (*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1b & 1) == 0)) {
    bVar1 = has_error(this);
    local_19 = 0;
    if ((!bVar1) &&
       (local_19 = 0, (*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0)) {
      local_19 = (byte)(*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1c) & 1 ^ 0xff;
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool torrent::should_check_files() const
	{
		TORRENT_ASSERT(is_single_thread());
		return m_state == torrent_status::checking_files
			&& !m_paused
			&& !has_error()
			&& !m_abort
			&& !m_session_paused;
	}